

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantity.cpp
# Opt level: O0

void __thiscall
polyscope::Quantity::Quantity(Quantity *this,string *name_,Structure *parentStructure_)

{
  Quantity *in_RDX;
  PersistentValue<bool> *in_RSI;
  ManagedBufferRegistry *in_RDI;
  string local_68 [32];
  string local_48 [40];
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  PersistentValue<bool> *this_00;
  
  this_00 = in_RSI;
  render::ManagedBufferRegistry::ManagedBufferRegistry(in_RDI);
  (in_RDI->managedBufferMap_float).allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Quantity_009901e8;
  in_RDI[1].managedBufferMap_float.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_RDX;
  std::__cxx11::string::string
            ((string *)
             &in_RDI[1].managedBufferMap_float.allBuffers.
              super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)in_RSI);
  uniquePrefix_abi_cxx11_(in_RDX);
  std::operator+(&in_RSI->name,(char *)in_RDI);
  PersistentValue<bool>::PersistentValue(this_00,(string *)in_RDX,(bool)in_stack_ffffffffffffffe7);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  validateName((string *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

Quantity::Quantity(std::string name_, Structure& parentStructure_)
    : parent(parentStructure_), name(name_), enabled(uniquePrefix() + "enabled", false) {
  validateName(name);
}